

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorK<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  NodeRef nodeRef;
  ulong uVar11;
  ulong *puVar12;
  undefined1 (*pauVar13) [32];
  ulong uVar14;
  ulong uVar15;
  Primitive *prim;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar23;
  undefined1 auVar24 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  Precalculations pre;
  vint8 bi;
  vbool<8> valid0;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_59c1;
  RayK<8> *local_59c0;
  ulong local_59b8;
  RayK<8> *local_59b0;
  ulong local_59a8;
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5960;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  undefined4 uStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  undefined4 uStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  undefined4 uStack_5844;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5840;
  undefined8 local_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar25 [64];
  undefined1 auVar31 [32];
  
  local_5808[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_5808[0] != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar18 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar20 = ZEXT816(0) << 0x40;
      auVar6 = vpcmpeqd_avx2(auVar18,(undefined1  [32])valid_i->field_0);
      auVar18 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar20),5);
      auVar5 = auVar6 & auVar18;
      if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar5 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar5 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar5 >> 0x7f,0) != '\0') ||
            (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar5 >> 0xbf,0) != '\0') ||
          (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar5[0x1f] < '\0')
      {
        auVar18 = vandps_avx(auVar18,auVar6);
        auVar4 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
        auVar28._8_4_ = 0x7fffffff;
        auVar28._0_8_ = 0x7fffffff7fffffff;
        auVar28._12_4_ = 0x7fffffff;
        auVar28._16_4_ = 0x7fffffff;
        auVar28._20_4_ = 0x7fffffff;
        auVar28._24_4_ = 0x7fffffff;
        auVar28._28_4_ = 0x7fffffff;
        auVar30._8_4_ = 0x219392ef;
        auVar30._0_8_ = 0x219392ef219392ef;
        auVar30._12_4_ = 0x219392ef;
        auVar31._16_4_ = 0x219392ef;
        auVar31._0_16_ = auVar30;
        auVar31._20_4_ = 0x219392ef;
        auVar31._24_4_ = 0x219392ef;
        auVar31._28_4_ = 0x219392ef;
        auVar18 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar28);
        auVar18 = vcmpps_avx(auVar18,auVar31,1);
        auVar5 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar31,auVar18);
        auVar18 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar28);
        auVar18 = vcmpps_avx(auVar18,auVar31,1);
        auVar18 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar31,auVar18);
        auVar6 = vrcpps_avx(auVar5);
        auVar34._8_4_ = 0x3f800000;
        auVar34._0_8_ = &DAT_3f8000003f800000;
        auVar34._12_4_ = 0x3f800000;
        auVar34._16_4_ = 0x3f800000;
        auVar34._20_4_ = 0x3f800000;
        auVar34._24_4_ = 0x3f800000;
        auVar34._28_4_ = 0x3f800000;
        auVar7 = vfnmadd213ps_fma(auVar5,auVar6,auVar34);
        auVar22 = vrcpps_avx(auVar18);
        auVar8 = vfnmadd213ps_fma(auVar18,auVar22,auVar34);
        auVar18 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar28);
        auVar18 = vcmpps_avx(auVar18,auVar31,1);
        auVar18 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar31,auVar18);
        auVar5 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar20));
        auVar31 = vpmovsxwd_avx2(auVar4);
        auVar39 = ZEXT3264(auVar31);
        auVar30 = vpcmpeqd_avx(auVar30,auVar30);
        auVar28 = vrcpps_avx(auVar18);
        auVar9 = vfnmadd213ps_fma(auVar18,auVar28,auVar34);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar35 = ZEXT3264(local_4680);
        local_4660 = vblendvps_avx(local_4680,auVar5,auVar31);
        auVar40 = ZEXT3264(local_4660);
        local_59c0 = ray + 0x100;
        auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar28,auVar28);
        auVar38 = ZEXT1664(auVar9);
        auVar28 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar20));
        auVar18 = *(undefined1 (*) [32])ray;
        auVar20 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar6,auVar6);
        auVar36 = ZEXT1664(auVar20);
        auVar5 = *(undefined1 (*) [32])(ray + 0x20);
        auVar6 = *(undefined1 (*) [32])(ray + 0x40);
        local_5980 = vpmovsxwd_avx2(auVar4 ^ auVar30);
        auVar4 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar22,auVar22);
        auVar37 = ZEXT1664(auVar4);
        auVar22._8_4_ = 0xff800000;
        auVar22._0_8_ = 0xff800000ff800000;
        auVar22._12_4_ = 0xff800000;
        auVar22._16_4_ = 0xff800000;
        auVar22._20_4_ = 0xff800000;
        auVar22._24_4_ = 0xff800000;
        auVar22._28_4_ = 0xff800000;
        auVar25 = ZEXT3264(auVar22);
        local_59a0 = vblendvps_avx(auVar22,auVar28,auVar31);
        puVar12 = local_5808 + 1;
        local_5810 = 0xfffffffffffffff8;
        pauVar13 = (undefined1 (*) [32])local_4640;
        local_5860 = auVar20._0_4_ * -auVar18._0_4_;
        fStack_585c = auVar20._4_4_ * -auVar18._4_4_;
        fStack_5858 = auVar20._8_4_ * -auVar18._8_4_;
        fStack_5854 = auVar20._12_4_ * -auVar18._12_4_;
        fStack_5850 = -auVar18._16_4_ * 0.0;
        fStack_584c = -auVar18._20_4_ * 0.0;
        uStack_5884 = local_59a0._28_4_;
        fStack_5848 = -auVar18._24_4_ * 0.0;
        local_5880 = auVar9._0_4_ * -auVar5._0_4_;
        fStack_587c = auVar9._4_4_ * -auVar5._4_4_;
        fStack_5878 = auVar9._8_4_ * -auVar5._8_4_;
        fStack_5874 = auVar9._12_4_ * -auVar5._12_4_;
        fStack_5870 = -auVar5._16_4_ * 0.0;
        fStack_586c = -auVar5._20_4_ * 0.0;
        fStack_5868 = -auVar5._24_4_ * 0.0;
        local_58a0 = auVar4._0_4_ * -auVar6._0_4_;
        fStack_589c = auVar4._4_4_ * -auVar6._4_4_;
        fStack_5898 = auVar4._8_4_ * -auVar6._8_4_;
        fStack_5894 = auVar4._12_4_ * -auVar6._12_4_;
        fStack_5890 = -auVar6._16_4_ * 0.0;
        fStack_588c = -auVar6._20_4_ * 0.0;
        fStack_5888 = -auVar6._24_4_ * 0.0;
        local_59b0 = ray;
        uStack_5864 = uStack_5884;
        uStack_5844 = uStack_5884;
LAB_0069ee7c:
        pauVar13 = pauVar13 + -1;
        puVar1 = puVar12 + -1;
        puVar12 = puVar12 + -1;
        bVar17 = true;
        if (*puVar1 != 0xfffffffffffffff8) {
          auVar19 = ZEXT3264(*pauVar13);
          auVar18 = vcmpps_avx(*pauVar13,local_59a0,1);
          uVar14 = *puVar1;
          if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0x7f,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0xbf,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar18[0x1f] < '\0') {
            do {
              aVar23 = auVar25._0_32_;
              local_58c0 = auVar36._0_32_;
              local_5900 = auVar38._0_32_;
              local_58e0 = auVar37._0_32_;
              local_5940 = auVar40._0_32_;
              if ((uVar14 & 8) != 0) {
                if (uVar14 == 0xfffffffffffffff8) goto LAB_0069efdb;
                auVar18 = vcmpps_avx(local_59a0,auVar19._0_32_,6);
                if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar18 >> 0x7f,0) != '\0') ||
                      (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar18 >> 0xbf,0) != '\0') ||
                    (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar18[0x1f] < '\0') {
                  local_5920 = auVar39._0_32_;
                  auVar18 = vpcmpeqd_avx2(auVar18,auVar18);
                  local_59a8 = (ulong)((uint)uVar14 & 0xf) - 8;
                  local_5960 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)(auVar18 ^ local_5980)
                  ;
                  if (local_59a8 == 0) goto LAB_0069f0cf;
                  prim = (Primitive *)(uVar14 & 0xfffffffffffffff0);
                  local_59b8 = 1;
                  goto LAB_0069f068;
                }
                break;
              }
              auVar19 = ZEXT3264(auVar35._0_32_);
              uVar11 = 0;
              uVar15 = 8;
              do {
                uVar3 = *(ulong *)((uVar14 & 0xfffffffffffffff0) + uVar11 * 8);
                if (uVar3 != 8) {
                  uVar2 = *(undefined4 *)(uVar14 + 0x40 + uVar11 * 4);
                  auVar24._4_4_ = uVar2;
                  auVar24._0_4_ = uVar2;
                  auVar24._8_4_ = uVar2;
                  auVar24._12_4_ = uVar2;
                  auVar24._16_4_ = uVar2;
                  auVar24._20_4_ = uVar2;
                  auVar24._24_4_ = uVar2;
                  auVar24._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(uVar14 + 0x80 + uVar11 * 4);
                  auVar26._4_4_ = uVar2;
                  auVar26._0_4_ = uVar2;
                  auVar26._8_4_ = uVar2;
                  auVar26._12_4_ = uVar2;
                  auVar26._16_4_ = uVar2;
                  auVar26._20_4_ = uVar2;
                  auVar26._24_4_ = uVar2;
                  auVar26._28_4_ = uVar2;
                  auVar10._4_4_ = fStack_585c;
                  auVar10._0_4_ = local_5860;
                  auVar10._8_4_ = fStack_5858;
                  auVar10._12_4_ = fStack_5854;
                  auVar10._16_4_ = fStack_5850;
                  auVar10._20_4_ = fStack_584c;
                  auVar10._24_4_ = fStack_5848;
                  auVar10._28_4_ = uStack_5844;
                  auVar20 = vfmadd213ps_fma(auVar24,local_58c0,auVar10);
                  auVar6._4_4_ = fStack_587c;
                  auVar6._0_4_ = local_5880;
                  auVar6._8_4_ = fStack_5878;
                  auVar6._12_4_ = fStack_5874;
                  auVar6._16_4_ = fStack_5870;
                  auVar6._20_4_ = fStack_586c;
                  auVar6._24_4_ = fStack_5868;
                  auVar6._28_4_ = uStack_5864;
                  auVar4 = vfmadd213ps_fma(auVar26,local_5900,auVar6);
                  uVar2 = *(undefined4 *)(uVar14 + 0xc0 + uVar11 * 4);
                  auVar27._4_4_ = uVar2;
                  auVar27._0_4_ = uVar2;
                  auVar27._8_4_ = uVar2;
                  auVar27._12_4_ = uVar2;
                  auVar27._16_4_ = uVar2;
                  auVar27._20_4_ = uVar2;
                  auVar27._24_4_ = uVar2;
                  auVar27._28_4_ = uVar2;
                  auVar5._4_4_ = fStack_589c;
                  auVar5._0_4_ = local_58a0;
                  auVar5._8_4_ = fStack_5898;
                  auVar5._12_4_ = fStack_5894;
                  auVar5._16_4_ = fStack_5890;
                  auVar5._20_4_ = fStack_588c;
                  auVar5._24_4_ = fStack_5888;
                  auVar5._28_4_ = uStack_5884;
                  auVar30 = vfmadd213ps_fma(auVar27,local_58e0,auVar5);
                  uVar2 = *(undefined4 *)(uVar14 + 0x60 + uVar11 * 4);
                  auVar29._4_4_ = uVar2;
                  auVar29._0_4_ = uVar2;
                  auVar29._8_4_ = uVar2;
                  auVar29._12_4_ = uVar2;
                  auVar29._16_4_ = uVar2;
                  auVar29._20_4_ = uVar2;
                  auVar29._24_4_ = uVar2;
                  auVar29._28_4_ = uVar2;
                  auVar9 = vfmadd213ps_fma(auVar29,local_58c0,auVar10);
                  uVar2 = *(undefined4 *)(uVar14 + 0xa0 + uVar11 * 4);
                  auVar32._4_4_ = uVar2;
                  auVar32._0_4_ = uVar2;
                  auVar32._8_4_ = uVar2;
                  auVar32._12_4_ = uVar2;
                  auVar32._16_4_ = uVar2;
                  auVar32._20_4_ = uVar2;
                  auVar32._24_4_ = uVar2;
                  auVar32._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(uVar14 + 0xe0 + uVar11 * 4);
                  auVar33._4_4_ = uVar2;
                  auVar33._0_4_ = uVar2;
                  auVar33._8_4_ = uVar2;
                  auVar33._12_4_ = uVar2;
                  auVar33._16_4_ = uVar2;
                  auVar33._20_4_ = uVar2;
                  auVar33._24_4_ = uVar2;
                  auVar33._28_4_ = uVar2;
                  auVar7 = vfmadd213ps_fma(auVar32,local_5900,auVar6);
                  auVar8 = vfmadd213ps_fma(auVar33,local_58e0,auVar5);
                  auVar18 = vpminsd_avx2(ZEXT1632(auVar20),ZEXT1632(auVar9));
                  auVar5 = vpminsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar7));
                  auVar18 = vpmaxsd_avx2(auVar18,auVar5);
                  auVar5 = vpminsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar8));
                  auVar5 = vpmaxsd_avx2(auVar18,auVar5);
                  auVar18 = vpmaxsd_avx2(ZEXT1632(auVar20),ZEXT1632(auVar9));
                  auVar6 = vpmaxsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar7));
                  auVar28 = vpminsd_avx2(auVar18,auVar6);
                  auVar18 = vpmaxsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar8));
                  auVar6 = vpmaxsd_avx2(auVar5,local_5940);
                  auVar18 = vpminsd_avx2(auVar18,local_59a0);
                  auVar18 = vpminsd_avx2(auVar28,auVar18);
                  auVar18 = vcmpps_avx(auVar6,auVar18,2);
                  auVar25 = ZEXT3264(auVar18);
                  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar18 >> 0x7f,0) != '\0') ||
                        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar18 >> 0xbf,0) != '\0') ||
                      (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar18[0x1f] < '\0') {
                    auVar18 = vblendvps_avx(auVar35._0_32_,auVar5,auVar18);
                    if (uVar15 != 8) {
                      *puVar12 = uVar15;
                      puVar12 = puVar12 + 1;
                      *pauVar13 = auVar19._0_32_;
                      pauVar13 = pauVar13 + 1;
                    }
                    auVar19 = ZEXT3264(auVar18);
                    uVar15 = uVar3;
                  }
                }
              } while ((uVar3 != 8) && (bVar16 = uVar11 < 7, uVar11 = uVar11 + 1, bVar16));
              uVar14 = uVar15;
            } while (uVar15 != 8);
          }
          bVar17 = false;
        }
        goto LAB_0069efdb;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar17 = local_59a8 <= local_59b8;
    local_59b8 = local_59b8 + 1;
    if (bVar17) break;
LAB_0069f068:
    InstanceIntersectorK<8>::occluded
              ((vbool<8> *)&local_5840.field_1,(vbool<8> *)&local_5960.field_1,&local_59c1,
               local_59b0,context,prim);
    aVar23.v = (__m256)vandnps_avx(local_5840.v,local_5960.v);
    auVar18 = (undefined1  [32])local_5960 & ~(undefined1  [32])local_5840;
    local_5960 = aVar23;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar18 >> 0x7f,0) == '\0') &&
          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar18 >> 0xbf,0) == '\0') &&
        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar18[0x1f])
    break;
  }
LAB_0069f0cf:
  auVar18 = vpcmpeqd_avx2((undefined1  [32])aVar23,(undefined1  [32])aVar23);
  auVar25 = ZEXT3264(auVar18);
  local_5980 = vpor_avx2(local_5980,auVar18 ^ (undefined1  [32])local_5960);
  auVar18 = auVar18 & ~local_5980;
  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar18 >> 0x7f,0) == '\0') &&
        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar18 >> 0xbf,0) == '\0') &&
      (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar18[0x1f]) {
    auVar36 = ZEXT3264(local_58c0);
    auVar37 = ZEXT3264(local_58e0);
    auVar38 = ZEXT3264(local_5900);
    auVar39 = ZEXT3264(local_5920);
    auVar35 = ZEXT3264(CONCAT428(0x7f800000,
                                 CONCAT424(0x7f800000,
                                           CONCAT420(0x7f800000,
                                                     CONCAT416(0x7f800000,
                                                               CONCAT412(0x7f800000,
                                                                         CONCAT48(0x7f800000,
                                                                                  0x7f8000007f800000
                                                                                 )))))));
    auVar40 = ZEXT3264(local_5940);
    bVar17 = true;
  }
  else {
    auVar18._8_4_ = 0xff800000;
    auVar18._0_8_ = 0xff800000ff800000;
    auVar18._12_4_ = 0xff800000;
    auVar18._16_4_ = 0xff800000;
    auVar18._20_4_ = 0xff800000;
    auVar18._24_4_ = 0xff800000;
    auVar18._28_4_ = 0xff800000;
    local_59a0 = vblendvps_avx(local_59a0,auVar18,local_5980);
    auVar25 = ZEXT3264(local_59a0);
    bVar17 = false;
    auVar36 = ZEXT3264(local_58c0);
    auVar37 = ZEXT3264(local_58e0);
    auVar38 = ZEXT3264(local_5900);
    auVar39 = ZEXT3264(local_5920);
    auVar35 = ZEXT3264(CONCAT428(0x7f800000,
                                 CONCAT424(0x7f800000,
                                           CONCAT420(0x7f800000,
                                                     CONCAT416(0x7f800000,
                                                               CONCAT412(0x7f800000,
                                                                         CONCAT48(0x7f800000,
                                                                                  0x7f8000007f800000
                                                                                 )))))));
    auVar40 = ZEXT3264(local_5940);
  }
LAB_0069efdb:
  if (bVar17) {
    auVar18 = vandps_avx(auVar39._0_32_,local_5980);
    auVar21._8_4_ = 0xff800000;
    auVar21._0_8_ = 0xff800000ff800000;
    auVar21._12_4_ = 0xff800000;
    auVar21._16_4_ = 0xff800000;
    auVar21._20_4_ = 0xff800000;
    auVar21._24_4_ = 0xff800000;
    auVar21._28_4_ = 0xff800000;
    auVar18 = vmaskmovps_avx(auVar18,auVar21);
    *(undefined1 (*) [32])local_59c0 = auVar18;
    return;
  }
  goto LAB_0069ee7c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }